

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> * __thiscall
QPDFPageObjectHelper::getPageContents
          (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__return_storage_ptr__,
          QPDFPageObjectHelper *this)

{
  QPDFObjectHandle local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  QPDFPageObjectHelper *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_local = (QPDFPageObjectHelper *)__return_storage_ptr__;
  QPDFObjectHelper::oh((QPDFObjectHelper *)&local_28);
  QPDFObjectHandle::getPageContents(__return_storage_ptr__,&local_28);
  QPDFObjectHandle::~QPDFObjectHandle(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFObjectHandle>
QPDFPageObjectHelper::getPageContents()
{
    return oh().getPageContents();
}